

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool qt_cleanPath(QString *path)

{
  bool bVar1;
  qsizetype qVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool ok;
  QString *ret;
  QString *in_stack_00000110;
  PathNormalizations in_stack_0000017c;
  undefined4 in_stack_ffffffffffffffa8;
  PathNormalization in_stack_ffffffffffffffac;
  QString *in_stack_ffffffffffffffb0;
  QString *this;
  QString *pQVar3;
  bool local_27;
  QChar local_26 [15];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x190dd1);
  if (bVar1) {
    local_27 = true;
  }
  else {
    QDir::fromNativeSeparators
              ((QString *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QString::operator=(in_stack_ffffffffffffffb0,
                       (QString *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QString::~QString((QString *)0x190e22);
    this = in_RDI;
    QFlags<QDirPrivate::PathNormalization>::QFlags
              ((QFlags<QDirPrivate::PathNormalization> *)in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac);
    local_27 = qt_normalizePathSegments(in_stack_00000110,in_stack_0000017c);
    qVar2 = QString::size(this);
    if (1 < qVar2) {
      pQVar3 = this;
      QChar::QChar<char16_t,_true>(local_26,L'/');
      bVar1 = QString::endsWith(in_RDI,(QChar)(char16_t)((ulong)pQVar3 >> 0x30),
                                (CaseSensitivity)((ulong)this >> 0x20));
      if (bVar1) {
        QString::chop(this,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_27;
}

Assistant:

static bool qt_cleanPath(QString *path)
{
    if (path->isEmpty())
        return true;

    QString &ret = *path;
    ret = QDir::fromNativeSeparators(ret);
    bool ok = qt_normalizePathSegments(&ret, QDirPrivate::DefaultNormalization);

    // Strip away last slash except for root directories
    if (ret.size() > 1 && ret.endsWith(u'/')) {
#if defined (Q_OS_WIN)
        if (!(ret.length() == 3 && ret.at(1) == u':'))
#endif
            ret.chop(1);
    }

    return ok;
}